

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void draw_left_brace(Fl_Widget *w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Widget *w_local;
  
  iVar1 = Fl_Widget::x(w);
  iVar2 = Fl_Widget::y(w);
  iVar3 = Fl_Widget::x(w);
  fl_xyline(iVar1 + -2,iVar2,iVar3 + 6);
  iVar1 = Fl_Widget::x(w);
  iVar2 = Fl_Widget::y(w);
  iVar3 = Fl_Widget::h(w);
  iVar4 = Fl_Widget::x(w);
  fl_xyline(iVar1 + -2,iVar2 + iVar3 + -1,iVar4 + 6);
  iVar1 = Fl_Widget::x(w);
  iVar2 = Fl_Widget::y(w);
  iVar3 = Fl_Widget::y(w);
  iVar4 = Fl_Widget::h(w);
  fl_yxline(iVar1,iVar2 + -2,iVar3 + iVar4 + 1);
  return;
}

Assistant:

static void draw_left_brace(const Fl_Widget *w) {
  fl_xyline(w->x()-2, w->y(), w->x()+6);
  fl_xyline(w->x()-2, w->y()+w->h()-1, w->x()+6);
  fl_yxline(w->x(), w->y()-2, w->y()+w->h()+1);
}